

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O1

int pt_qry_decoder_init(pt_query_decoder *decoder,pt_config *uconfig)

{
  int iVar1;
  pt_config config;
  pt_config local_120;
  
  if (decoder != (pt_query_decoder *)0x0) {
    iVar1 = pt_config_from_user(&local_120,uconfig);
    if (-1 < iVar1) {
      *(undefined8 *)&(decoder->flags).variant = local_120.flags.variant._0_8_;
      *(undefined8 *)((long)&(decoder->flags).variant + 8) = local_120.flags.variant._8_8_;
      local_120.flags.variant._8_8_ = 0;
      local_120.flags.variant._0_8_ = (ulong)*(byte *)&(decoder->flags).variant & 0xffffffffffffff03
      ;
      iVar1 = pt_evt_decoder_init(&decoder->evdec,&local_120);
      if (-1 < iVar1) {
        decoder->status = -3;
        pt_tnt_cache_init(&decoder->tnt);
        pt_time_init(&decoder->last_time);
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  return -2;
}

Assistant:

int pt_qry_decoder_init(struct pt_query_decoder *decoder,
			const struct pt_config *uconfig)
{
	struct pt_config config;
	int errcode;

	if (!decoder)
		return -pte_invalid;

	errcode = pt_config_from_user(&config, uconfig);
	if (errcode < 0)
		return errcode;

	/* The user supplied decoder flags. */
	decoder->flags = config.flags;

	/* Set the flags we need for the event decoder we use. */
	errcode = pt_qry_init_evt_flags(&config.flags, &decoder->flags);
	if (errcode < 0)
		return errcode;

	errcode = pt_evt_decoder_init(&decoder->evdec, &config);
	if (errcode < 0)
		return errcode;

	return pt_qry_reset(decoder);
}